

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int CBS_get_until_first(CBS *cbs,CBS *out,uint8_t c)

{
  uint8_t *s;
  ulong n;
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  
  s = cbs->data;
  n = cbs->len;
  pvVar2 = OPENSSL_memchr(s,(int)CONCAT71(in_register_00000011,c),n);
  iVar1 = 0;
  if (pvVar2 != (void *)0x0) {
    uVar3 = (long)pvVar2 - (long)s;
    if (uVar3 <= n) {
      cbs->data = s + uVar3;
      cbs->len = n - uVar3;
      out->data = s;
      out->len = uVar3;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int CBS_get_until_first(CBS *cbs, CBS *out, uint8_t c) {
  const uint8_t *split = reinterpret_cast<const uint8_t *>(
      OPENSSL_memchr(CBS_data(cbs), c, CBS_len(cbs)));
  if (split == NULL) {
    return 0;
  }
  return CBS_get_bytes(cbs, out, split - CBS_data(cbs));
}